

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ising_polynomial_sa_system.hpp
# Opt level: O1

void __thiscall
openjij::system::
SASystem<openjij::graph::IsingPolynomialModel<double>,_std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_>
::Flip(SASystem<openjij::graph::IsingPolynomialModel<double>,_std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_>
       *this,int32_t index)

{
  char *pcVar1;
  double dVar2;
  short sVar3;
  int iVar4;
  pointer pvVar5;
  pointer puVar6;
  pointer psVar7;
  pointer ppVar8;
  unsigned_long uVar9;
  int *piVar10;
  pointer pcVar11;
  pointer pdVar12;
  unsigned_long *index_key;
  pointer puVar13;
  int *v_index;
  int *piVar14;
  
  pcVar1 = (this->sample_).super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
           super__Vector_impl_data._M_start + index;
  *pcVar1 = -*pcVar1;
  pvVar5 = (this->adjacency_list_->
           super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  puVar13 = pvVar5[index].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start;
  puVar6 = *(pointer *)
            ((long)&pvVar5[index].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data + 8);
  if (puVar13 != puVar6) {
    psVar7 = (this->term_prod_).super__Vector_base<short,_std::allocator<short>_>._M_impl.
             super__Vector_impl_data._M_start;
    ppVar8 = (this->key_value_list_->
             super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    do {
      uVar9 = *puVar13;
      dVar2 = ppVar8[uVar9].second;
      sVar3 = psVar7[uVar9];
      psVar7[uVar9] = -sVar3;
      piVar14 = *(int **)&ppVar8[uVar9].first.super__Vector_base<int,_std::allocator<int>_>._M_impl;
      piVar10 = *(pointer *)
                 ((long)&ppVar8[uVar9].first.super__Vector_base<int,_std::allocator<int>_>._M_impl +
                 8);
      if (piVar14 != piVar10) {
        pcVar11 = (this->sample_).super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        pdVar12 = (this->base_energy_difference_).
                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
        do {
          iVar4 = *piVar14;
          if (iVar4 != index) {
            pdVar12[iVar4] =
                 (double)(int)pcVar11[iVar4] * dVar2 * -2.0 * (double)(int)sVar3 + pdVar12[iVar4];
          }
          piVar14 = piVar14 + 1;
        } while (piVar14 != piVar10);
      }
      puVar13 = puVar13 + 1;
    } while (puVar13 != puVar6);
  }
  return;
}

Assistant:

void Flip(const std::int32_t index) {
      sample_[index] *= -1;
      for (const auto &index_key: adjacency_list_[index]) {
         const ValueType val = -2*key_value_list_[index_key].second*term_prod_[index_key];
         term_prod_[index_key] *= -1;
         for (const auto &v_index: key_value_list_[index_key].first) {
            if (v_index != index) {
               base_energy_difference_[v_index] += val*sample_[v_index];
            }
         }
      }
   }